

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usertimer.cpp
# Opt level: O0

Real __thiscall soplex::UserTimer::stop(UserTimer *this)

{
  UserTimer *in_RDI;
  Real RVar1;
  
  if ((in_RDI->super_Timer).status == RUNNING) {
    updateTicks(this);
    in_RDI->uAccount = in_RDI->uTicks + in_RDI->uAccount;
    (in_RDI->super_Timer).status = STOPPED;
  }
  RVar1 = ticks2sec(in_RDI,in_RDI->uAccount);
  return RVar1;
}

Assistant:

Real UserTimer::stop()
{
   // status remains unchanged if timer is not running
   if(status == RUNNING)
   {
      updateTicks();

      uAccount += uTicks;
      status    = STOPPED;
   }

   return ticks2sec(uAccount);
}